

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

ssize_t __thiscall
perfetto::base::UnixSocketRaw::Send
          (UnixSocketRaw *this,void *msg,size_t len,int *send_fds,size_t num_fds)

{
  code *pcVar1;
  int iVar2;
  uint uVar3;
  char *fname;
  uint *puVar4;
  int *piVar5;
  char *pcVar6;
  ssize_t sVar7;
  ulong *local_1b0;
  cmsghdr *cmsg;
  CBufLenType control_buf_len;
  unsigned_long raw_ctl_data_sz;
  char control_buf [256];
  iovec iov;
  msghdr msg_hdr;
  size_t num_fds_local;
  int *send_fds_local;
  size_t len_local;
  void *msg_local;
  UnixSocketRaw *this_local;
  
  memset(&iov.iov_len,0,0x38);
  control_buf._248_8_ = msg;
  iov.iov_base = (void *)len;
  if (num_fds != 0) {
    iVar2 = (int)(num_fds << 2);
    uVar3 = (iVar2 + 7U & 0xfffffff8) + 0x10;
    if (0x100 < uVar3) {
      fname = Basename(
                      "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                      );
      puVar4 = (uint *)__errno_location();
      uVar3 = *puVar4;
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      LogMessage(kLogError,fname,0x10837,"%s (errno: %d, %s)",
                 "PERFETTO_CHECK(control_buf_len <= sizeof(control_buf))",(ulong)uVar3,pcVar6);
      MaybeSerializeLastLogsForCrashReporting();
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    memset(&raw_ctl_data_sz,0,0x100);
    local_1b0 = &raw_ctl_data_sz;
    if (uVar3 < 0x10) {
      local_1b0 = (ulong *)0x0;
    }
    *(undefined4 *)(local_1b0 + 1) = 1;
    *(undefined4 *)((long)local_1b0 + 0xc) = 1;
    *local_1b0 = (ulong)(iVar2 + 0x10);
    memcpy(local_1b0 + 2,send_fds,num_fds << 2);
  }
  sVar7 = SendMsgAllPosix(this,(msghdr *)&iov.iov_len);
  return sVar7;
}

Assistant:

ssize_t UnixSocketRaw::Send(const void* msg,
                            size_t len,
                            const int* send_fds,
                            size_t num_fds) {
  PERFETTO_DCHECK(fd_);
  msghdr msg_hdr = {};
  iovec iov = {const_cast<void*>(msg), len};
  msg_hdr.msg_iov = &iov;
  msg_hdr.msg_iovlen = 1;
  alignas(cmsghdr) char control_buf[256];

  if (num_fds > 0) {
    const auto raw_ctl_data_sz = num_fds * sizeof(int);
    const CBufLenType control_buf_len =
        static_cast<CBufLenType>(CMSG_SPACE(raw_ctl_data_sz));
    PERFETTO_CHECK(control_buf_len <= sizeof(control_buf));
    memset(control_buf, 0, sizeof(control_buf));
    msg_hdr.msg_control = control_buf;
    msg_hdr.msg_controllen = control_buf_len;  // used by CMSG_FIRSTHDR
    struct cmsghdr* cmsg = CMSG_FIRSTHDR(&msg_hdr);
    cmsg->cmsg_level = SOL_SOCKET;
    cmsg->cmsg_type = SCM_RIGHTS;
    cmsg->cmsg_len = static_cast<CBufLenType>(CMSG_LEN(raw_ctl_data_sz));
    memcpy(CMSG_DATA(cmsg), send_fds, num_fds * sizeof(int));
    // note: if we were to send multiple cmsghdr structures, then
    // msg_hdr.msg_controllen would need to be adjusted, see "man 3 cmsg".
  }

  return SendMsgAllPosix(&msg_hdr);
}